

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O3

void ImGui_ImplOpenGL2_Shutdown(void)

{
  ImGuiContext *pIVar1;
  ImGuiIO *pIVar2;
  void *ptr;
  
  pIVar1 = ImGui::GetCurrentContext();
  if (pIVar1 == (ImGuiContext *)0x0) {
    ptr = (void *)0x0;
  }
  else {
    pIVar2 = ImGui::GetIO();
    ptr = pIVar2->BackendRendererUserData;
  }
  pIVar2 = ImGui::GetIO();
  ImGui_ImplOpenGL2_DestroyFontsTexture();
  pIVar2->BackendRendererName = (char *)0x0;
  pIVar2->BackendRendererUserData = (void *)0x0;
  if (ptr != (void *)0x0) {
    ImGui::MemFree(ptr);
    return;
  }
  return;
}

Assistant:

static ImGui_ImplOpenGL2_Data* ImGui_ImplOpenGL2_GetBackendData()
{
    return ImGui::GetCurrentContext() ? (ImGui_ImplOpenGL2_Data*)ImGui::GetIO().BackendRendererUserData : nullptr;
}